

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringNStd.cpp
# Opt level: O2

void testStringNStd(int iterations)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  String local_f8;
  String local_d0;
  String blah [3];
  
  srand(100);
  blah[0].data = &blah[0]._data;
  blah[0]._data.ref = 0;
  blah[0]._data.str =
       "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
  blah[0]._data.len = 0x50;
  blah[1].data = &blah[1]._data;
  blah[1]._data.ref = 0;
  blah[1]._data.str =
       "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688";
  blah[1]._data.len = 0x50;
  blah[2].data = &blah[2]._data;
  blah[2]._data.ref = 0;
  blah[2]._data.str =
       "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698";
  blah[2]._data.len = 0x50;
  iVar3 = 0;
  if (0 < iterations) {
    iVar3 = iterations;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    local_d0.data = &local_d0._data;
    local_d0._data.ref = 0;
    local_d0._data.str =
         "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
    local_d0._data.len = 0x50;
    iVar1 = rand();
    bVar4 = String::operator==(&local_d0,blah + iVar1 % 3);
    String::~String(&local_d0);
    if (bVar4) {
      local_f8.data = &local_f8._data;
      local_f8._data.ref = 0;
      local_f8._data.str =
           "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
      local_f8._data.len = 0x50;
      iVar1 = rand();
      String::operator+(&local_d0,&local_f8,blah + iVar1 % 3);
      String::~String(&local_d0);
      String::~String(&local_f8);
    }
  }
  lVar2 = 0x50;
  do {
    String::~String((String *)((long)&blah[0].data + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  return;
}

Assistant:

void testStringNStd(int iterations)
{
  srand(100);
  usize val = 0;
  String blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}